

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeAppendP4(Vdbe *p,void *pP4,int n)

{
  int iVar1;
  Op *pOVar2;
  
  if (p->db->mallocFailed != '\0') {
    freeP4(p->db,n,pP4);
    return;
  }
  pOVar2 = p->aOp;
  iVar1 = p->nOp;
  pOVar2[(long)iVar1 + -1].p4type = (char)n;
  pOVar2[(long)iVar1 + -1].p4.p = pP4;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeAppendP4(Vdbe *p, void *pP4, int n){
  VdbeOp *pOp;
  assert( n!=P4_INT32 && n!=P4_VTAB );
  assert( n<=0 );
  if( p->db->mallocFailed ){
    freeP4(p->db, n, pP4);
  }else{
    assert( pP4!=0 );
    assert( p->nOp>0 );
    pOp = &p->aOp[p->nOp-1];
    assert( pOp->p4type==P4_NOTUSED );
    pOp->p4type = n;
    pOp->p4.p = pP4;
  }
}